

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_20.cpp
# Opt level: O3

void __thiscall FRenderState::DrawColormapOverlay(FRenderState *this)

{
  undefined8 uVar1;
  uint uVar2;
  FSpecialColormap *pFVar3;
  float fVar4;
  float fVar5;
  
  uVar2 = this->mColormapState;
  if ((int)uVar2 < 1) {
    return;
  }
  if ((int)uVar2 < (int)(SpecialColormaps.Count + 1)) {
    uVar2 = gl_fixedcolormap - 1;
    fVar4 = (float)*(undefined8 *)SpecialColormaps.Array[uVar2].ColorizeEnd;
    fVar5 = (float)((ulong)*(undefined8 *)SpecialColormaps.Array[uVar2].ColorizeEnd >> 0x20);
    gl_RenderState.mColor.vec[2] = SpecialColormaps.Array[uVar2].ColorizeEnd[2];
    if (((fVar4 < SpecialColormaps.Array[uVar2].ColorizeStart[0]) &&
        (fVar5 < SpecialColormaps.Array[uVar2].ColorizeStart[1])) &&
       (gl_RenderState.mColor.vec[2] < SpecialColormaps.Array[uVar2].ColorizeStart[2])) {
      pFVar3 = SpecialColormaps.Array + uVar2;
      gl_RenderState.mColor.vec[0] = 1.0;
      gl_RenderState.mColor.vec[1] = 1.0;
      gl_RenderState.mColor.vec[2] = 1.0;
      gl_RenderState.mColor.vec[3] = 1.0;
      gl_RenderState.mDesaturation = 0;
      if (gl_direct_state_change.Value) {
        (*_ptrc_glBlendFunc)(0x307,0);
      }
      else {
        gl_RenderState.mSrcBlend = 0x307;
        gl_RenderState.mDstBlend = 0;
      }
      gl_FillScreen();
      uVar1 = *(undefined8 *)pFVar3->ColorizeStart;
      fVar4 = (float)uVar1;
      fVar5 = (float)((ulong)uVar1 >> 0x20);
      gl_RenderState.mColor.vec[2] = pFVar3->ColorizeStart[2];
    }
  }
  else if (uVar2 == 0x20000000) {
    if (!gl_enhanced_nightvision.Value) {
      return;
    }
    fVar4 = 0.375;
    fVar5 = 1.0;
    gl_RenderState.mColor.vec[2] = 0.375;
  }
  else {
    if (uVar2 < 0x20000010) {
      return;
    }
    fVar4 = (float)(int)(0x20000017 - uVar2) * 0.014285714 + 0.8;
    if (1.0 <= fVar4) {
      fVar4 = 1.0;
    }
    fVar5 = fVar4;
    gl_RenderState.mColor.vec[2] = fVar4;
    if (gl_enhanced_nightvision.Value) {
      gl_RenderState.mColor.vec[2] = fVar4 * 0.75;
    }
  }
  gl_RenderState.mColor.vec[1] = fVar5;
  gl_RenderState.mColor.vec[0] = fVar4;
  gl_RenderState.mColor.vec[3] = 1.0;
  gl_RenderState.mDesaturation = 0;
  if (gl_direct_state_change.Value == false) {
    gl_RenderState.mSrcBlend = 0x306;
    gl_RenderState.mDstBlend = 0;
  }
  else {
    (*_ptrc_glBlendFunc)(0x306,0);
  }
  gl_FillScreen();
  if (gl_direct_state_change.Value == false) {
    gl_RenderState.mSrcBlend = 0x302;
    gl_RenderState.mDstBlend = 0x303;
    return;
  }
  (*_ptrc_glBlendFunc)(0x302,0x303);
  return;
}

Assistant:

void FRenderState::DrawColormapOverlay()
{
	float r, g, b;
	if (mColormapState > CM_DEFAULT && mColormapState < CM_MAXCOLORMAP)
	{
		FSpecialColormap *scm = &SpecialColormaps[gl_fixedcolormap - CM_FIRSTSPECIALCOLORMAP];
		float m[] = { scm->ColorizeEnd[0] - scm->ColorizeStart[0],
			scm->ColorizeEnd[1] - scm->ColorizeStart[1], scm->ColorizeEnd[2] - scm->ColorizeStart[2], 0.f };

		if (m[0] < 0 && m[1] < 0 && m[2] < 0)
		{
			gl_RenderState.SetColor(1, 1, 1, 1);
			gl_RenderState.BlendFunc(GL_ONE_MINUS_DST_COLOR, GL_ZERO);
			gl_FillScreen();

			r = scm->ColorizeStart[0];
			g = scm->ColorizeStart[1];
			b = scm->ColorizeStart[2];
		}
		else
		{
			r = scm->ColorizeEnd[0];
			g = scm->ColorizeEnd[1];
			b = scm->ColorizeEnd[2];
		}
	}
	else if (mColormapState == CM_LITE)
	{
		if (gl_enhanced_nightvision)
		{
			r = 0.375f, g = 1.0f, b = 0.375f;
		}
		else
		{
			return;
		}
	}
	else if (mColormapState >= CM_TORCH)
	{
		int flicker = mColormapState - CM_TORCH;
		r = (0.8f + (7 - flicker) / 70.0f);
		if (r > 1.0f) r = 1.0f;
		b = g = r;
		if (gl_enhanced_nightvision) b = g * 0.75f;
	}
	else return;

	gl_RenderState.SetColor(r, g, b, 1.f);
	gl_RenderState.BlendFunc(GL_DST_COLOR, GL_ZERO);
	gl_FillScreen();
	gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
}